

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::BasicBlock::GetMergeInst(BasicBlock *this)

{
  bool bVar1;
  Op OVar2;
  Instruction *this_00;
  undefined1 local_28 [4];
  Op opcode;
  const_iterator iter;
  Instruction *result;
  BasicBlock *this_local;
  
  iter.node_ = (Instruction *)0x0;
  ctail((BasicBlock *)&stack0xffffffffffffffe0);
  cbegin((BasicBlock *)local_28);
  bVar1 = utils::operator!=((iterator_template<const_spvtools::opt::Instruction> *)
                            &stack0xffffffffffffffe0,
                            (iterator_template<const_spvtools::opt::Instruction> *)local_28);
  if (bVar1) {
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator--
              ((iterator_template<const_spvtools::opt::Instruction> *)&stack0xffffffffffffffe0);
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<const_spvtools::opt::Instruction>::operator->
                        ((iterator_template<const_spvtools::opt::Instruction> *)
                         &stack0xffffffffffffffe0);
    OVar2 = Instruction::opcode(this_00);
    if ((OVar2 == OpLoopMerge) || (OVar2 == OpSelectionMerge)) {
      iter.node_ = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<const_spvtools::opt::Instruction>::operator*
                             ((iterator_template<const_spvtools::opt::Instruction> *)
                              &stack0xffffffffffffffe0);
    }
  }
  return iter.node_;
}

Assistant:

const Instruction* BasicBlock::GetMergeInst() const {
  const Instruction* result = nullptr;
  // If it exists, the merge instruction immediately precedes the
  // terminator.
  auto iter = ctail();
  if (iter != cbegin()) {
    --iter;
    const auto opcode = iter->opcode();
    if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge) {
      result = &*iter;
    }
  }
  return result;
}